

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_undo(EditLine *el,wint_t c)

{
  long lVar1;
  undefined8 uVar2;
  wchar_t *pwVar3;
  c_undo_t un;
  wint_t c_local;
  EditLine *el_local;
  
  lVar1 = (el->el_chared).c_undo.len;
  uVar2 = *(undefined8 *)&(el->el_chared).c_undo.cursor;
  pwVar3 = (el->el_chared).c_undo.buf;
  if (lVar1 == -1) {
    el_local._7_1_ = '\x06';
  }
  else {
    (el->el_chared).c_undo.buf = (el->el_line).buffer;
    (el->el_chared).c_undo.len = (long)(el->el_line).lastchar - (long)(el->el_line).buffer >> 2;
    (el->el_chared).c_undo.cursor =
         (wchar_t)((long)(el->el_line).cursor - (long)(el->el_line).buffer >> 2);
    (el->el_line).limit = pwVar3 + ((long)(el->el_line).limit - (long)(el->el_line).buffer >> 2);
    (el->el_line).buffer = pwVar3;
    un.len._0_4_ = (int)uVar2;
    (el->el_line).cursor = pwVar3 + (int)un.len;
    (el->el_line).lastchar = pwVar3 + lVar1;
    el_local._7_1_ = '\x04';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_undo(EditLine *el, wint_t c __attribute__((__unused__)))
{
	c_undo_t un = el->el_chared.c_undo;

	if (un.len == -1)
		return CC_ERROR;

	/* switch line buffer and undo buffer */
	el->el_chared.c_undo.buf = el->el_line.buffer;
	el->el_chared.c_undo.len = el->el_line.lastchar - el->el_line.buffer;
	el->el_chared.c_undo.cursor =
	    (int)(el->el_line.cursor - el->el_line.buffer);
	el->el_line.limit = un.buf + (el->el_line.limit - el->el_line.buffer);
	el->el_line.buffer = un.buf;
	el->el_line.cursor = un.buf + un.cursor;
	el->el_line.lastchar = un.buf + un.len;

	return CC_REFRESH;
}